

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imleDemo_common.hpp
# Opt level: O3

void doubleCos1D_eval<IMLE>(IMLE *imleObj)

{
  uint uVar1;
  undefined1 auVar2 [16];
  double dVar3;
  undefined1 auVar4 [16];
  double *pdVar5;
  IMLE *pIVar6;
  Index index;
  ulong uVar7;
  double *pdVar8;
  ostream *poVar9;
  long *plVar10;
  undefined8 *puVar11;
  long lVar12;
  ulong uVar13;
  ActualDstType actualDst;
  long lVar14;
  undefined1 auVar15 [16];
  undefined8 extraout_XMM0_Qb;
  double dVar16;
  double dVar17;
  undefined1 auVar18 [16];
  Vec zTest;
  ArrayX x;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_d8;
  double local_c8;
  double local_c0;
  Z local_b8;
  IMLE *local_a0;
  vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  local_98;
  double local_78;
  undefined8 uStack_70;
  ArrayX *local_60;
  double local_58;
  double local_48;
  undefined8 uStack_40;
  
  local_98.
  super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.
  super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.
  super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_d8.m_storage.m_data = (double *)0x0;
  local_d8.m_storage.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_d8,100,1);
  if (local_d8.m_storage.m_rows == 100) {
    uVar7 = 100;
    lVar12 = 100;
  }
  else {
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_d8,100,1);
    uVar7 = local_d8.m_storage.m_rows - (local_d8.m_storage.m_rows >> 0x3f) & 0xfffffffffffffffe;
    lVar12 = local_d8.m_storage.m_rows;
    if (local_d8.m_storage.m_rows < 2) goto LAB_0014127c;
  }
  lVar14 = 0;
  dVar16 = (double)DAT_0018a060;
  dVar17 = DAT_0018a060._8_8_;
  do {
    dVar3 = ((double)lVar14 + 1.0) * dVar17 + 0.0;
    if (lVar14 == 0x62) {
      dVar3 = 12.566370614359172;
    }
    auVar2._8_4_ = SUB84(dVar3,0);
    auVar2._0_8_ = ((double)lVar14 + 0.0) * dVar16 + 0.0;
    auVar2._12_4_ = (int)((ulong)dVar3 >> 0x20);
    *(undefined1 (*) [16])(local_d8.m_storage.m_data + lVar14) = auVar2;
    lVar14 = lVar14 + 2;
  } while (lVar14 < (long)uVar7);
LAB_0014127c:
  auVar4 = _DAT_0018a020;
  auVar2 = _DAT_0018a010;
  lVar14 = lVar12 - uVar7;
  if (lVar14 != 0 && (long)uVar7 <= lVar12) {
    lVar12 = lVar14 + -1;
    auVar15._8_4_ = (int)lVar12;
    auVar15._0_8_ = lVar12;
    auVar15._12_4_ = (int)((ulong)lVar12 >> 0x20);
    uVar13 = 0;
    auVar15 = auVar15 ^ _DAT_0018a020;
    do {
      auVar18._8_4_ = (int)uVar13;
      auVar18._0_8_ = uVar13;
      auVar18._12_4_ = (int)(uVar13 >> 0x20);
      auVar18 = (auVar18 | auVar2) ^ auVar4;
      if ((bool)(~(auVar18._4_4_ == auVar15._4_4_ && auVar15._0_4_ < auVar18._0_4_ ||
                  auVar15._4_4_ < auVar18._4_4_) & 1)) {
        local_d8.m_storage.m_data[uVar7 + uVar13] =
             (double)(long)(uVar7 + uVar13) * 0.12693303650867852 + 0.0;
      }
      if ((auVar18._12_4_ != auVar15._12_4_ || auVar18._8_4_ <= auVar15._8_4_) &&
          auVar18._12_4_ <= auVar15._12_4_) {
        local_d8.m_storage.m_data[uVar7 + uVar13 + 1] =
             (double)(long)(uVar7 + uVar13 + 1) * 0.12693303650867852 + 0.0;
      }
      uVar13 = uVar13 + 2;
    } while ((lVar14 + 1U & 0xfffffffffffffffe) != uVar13);
  }
  local_60 = &imleObj->predictions;
  local_c0 = 0.0;
  lVar12 = 0;
  local_c8 = 0.0;
  local_a0 = imleObj;
  do {
    pdVar5 = local_d8.m_storage.m_data;
    local_b8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
         (double *)0x0;
    local_b8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
    pdVar8 = (double *)malloc(8);
    pIVar6 = local_a0;
    if (pdVar8 == (double *)0x0) {
      puVar11 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar11 = operator_delete;
      __cxa_throw(puVar11,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
    local_b8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 1;
    *pdVar8 = pdVar5[lVar12];
    local_b8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
         pdVar8;
    IMLE::predictMultiple(local_a0,&local_b8);
    free(local_b8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
    uVar1 = pIVar6->nSolFound;
    std::
    vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
    ::operator=(&local_98,local_60);
    local_78 = cos(local_d8.m_storage.m_data[lVar12]);
    local_58 = local_78 + 4.0;
    uStack_70 = extraout_XMM0_Qb;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"z = ",4);
    poVar9 = std::ostream::_M_insert<double>(local_d8.m_storage.m_data[lVar12]);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9," --> \tTargets: ",0xf);
    poVar9 = std::ostream::_M_insert<double>(local_78);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"   ",3);
    poVar9 = std::ostream::_M_insert<double>(local_58);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n\t\t    Predictions: ",0x14);
    if (0 < (int)uVar1) {
      local_48 = local_78 + 2.0;
      uStack_40 = uStack_70;
      lVar14 = 0;
      do {
        poVar9 = std::ostream::_M_insert<double>
                           (**(double **)
                              ((long)&((local_98.
                                        super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->
                                      super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                      ).m_storage.m_data + lVar14));
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"   ",3);
        dVar16 = **(double **)
                   ((long)&((local_98.
                             super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->
                           super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage
                           .m_data + lVar14);
        uVar7 = -(ulong)(dVar16 < local_48);
        dVar16 = dVar16 - (double)(~uVar7 & (ulong)local_58 | uVar7 & (ulong)local_78);
        local_c0 = local_c0 + dVar16 * dVar16;
        lVar14 = lVar14 + 0x10;
      } while ((ulong)uVar1 << 4 != lVar14);
    }
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
    pIVar6 = local_a0;
    std::ostream::put('(');
    std::ostream::flush();
    local_c8 = local_c8 + (double)(int)uVar1;
    lVar12 = lVar12 + 1;
  } while (lVar12 != 100);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"\t --- doubleCos1D_eval: ---",0x1b);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
  std::ostream::put('(');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"\t\tNumber of experts created: ",0x1d);
  plVar10 = (long *)std::ostream::operator<<(&std::cout,pIVar6->M);
  std::ios::widen((char)*(undefined8 *)(*plVar10 + -0x18) + (char)plVar10);
  std::ostream::put((char)plVar10);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"\t\tAverage number of predicted solutions: ",0x29);
  poVar9 = std::ostream::_M_insert<double>(local_c8 / 100.0);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
  std::ostream::put((char)poVar9);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\t\tRMSE: ",8);
  dVar16 = local_c0 / local_c8;
  if (dVar16 < 0.0) {
    dVar16 = sqrt(dVar16);
  }
  else {
    dVar16 = SQRT(dVar16);
  }
  poVar9 = std::ostream::_M_insert<double>(dVar16);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
  std::ostream::put((char)poVar9);
  std::ostream::flush();
  free(local_d8.m_storage.m_data);
  std::
  vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
  ::~vector(&local_98);
  return;
}

Assistant:

void doubleCos1D_eval( Learner &imleObj)
{
	const int nTest = 100;
    typename Learner::ArrayX x;
	Vec zTest = Vec::LinSpaced(100, 0.0, 4*M_PI);
	int nSol;
	Scal err;

	Scal sumSol = 0;
	Scal sumErrSqr = 0.0;

	for( int i = 0; i < nTest; i++)
	{
		imleObj.predictMultiple(zTest.row(i));

		nSol = imleObj.getNumberOfSolutionsFound();
		x = imleObj.getMultiplePredictions();

        Scal x1 = cos(zTest[i]);
        Scal x2 = x1 + 4.0;

        cout << "z = " << zTest[i] << " --> \tTargets: " << x1 << "   " << x2 << "\n\t\t    Predictions: ";
		for(int k = 0; k < nSol; k++)
		{
		    cout << x[k][0] << "   ";

			if( x[k][0] < x1 + 2.0 )	// Getting the closest true value to the IMLE estimate, and using it to calculate the error
				err = x[k][0] - x1;
			else
				err = x[k][0] - x2;

			sumErrSqr += err*err;
		}
		sumSol += nSol;
        cout << endl;
	}
	cout << "\t --- doubleCos1D_eval: ---" << endl;
	cout << "\t\tNumber of experts created: " << imleObj.getNumberOfExperts() << endl;
	cout << "\t\tAverage number of predicted solutions: " << sumSol/nTest << endl;
	cout << "\t\tRMSE: " << sqrt( sumErrSqr / sumSol ) << endl;
}